

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O0

void check_unrecorgnized_args_before_exit(void)

{
  bool bVar1;
  int i;
  iterator in_stack_ffffffffffffffe8;
  iterator in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff8;
  int iVar2;
  
  for (iVar2 = 1; iVar2 < argc__; iVar2 = iVar2 + 1) {
    in_stack_fffffffffffffff0 =
         std::set<int,_std::less<int>,_std::allocator<int>_>::find
                   ((set<int,_std::less<int>,_std::allocator<int>_> *)
                    CONCAT44(iVar2,in_stack_fffffffffffffff8),in_stack_fffffffffffffff0._M_node);
    in_stack_ffffffffffffffe8 =
         std::set<int,_std::less<int>,_std::allocator<int>_>::end(in_stack_ffffffffffffffe8._M_node)
    ;
    bVar1 = std::operator==((_Self *)&stack0xfffffffffffffff0,(_Self *)&stack0xffffffffffffffe8);
    if (bVar1) {
      CompilationContext::setErrorLevel(4);
      fprintf((FILE *)out_stream,"\nERROR: unrecognized argument \"%s\"\n",argv__[iVar2]);
    }
  }
  return;
}

Assistant:

static void check_unrecorgnized_args_before_exit()
{
  for (int i = 1; i < argc__; i++)
    if (used_args.find(i) == used_args.end())
    {
      CompilationContext::setErrorLevel(ERRORLEVEL_FATAL);
      fprintf(out_stream, "\nERROR: unrecognized argument \"%s\"\n", argv__[i]);
    }
}